

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::GenerateSymbolImports
          (EnumGenerator *this,Printer *printer)

{
  char cVar1;
  FileOptions_OptimizeMode FVar2;
  EnumDescriptor *pEVar3;
  char *pcVar4;
  EnumValueDescriptor *enum_value;
  long lVar5;
  long lVar6;
  char *pcVar7;
  Formatter format;
  string deprecated_attr;
  cpp *local_b0;
  Formatter local_a8;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a8.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_a8.vars_._M_t,&(this->variables_)._M_t);
  Formatter::operator()<>(&local_a8,"typedef $classname$ $resolved_name$;\n");
  pEVar3 = this->descriptor_;
  if (0 < *(int *)(pEVar3 + 4)) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      cVar1 = *(char *)(*(long *)(*(long *)(pEVar3 + 0x28) + 0x18 + lVar6) + 0x48);
      pcVar7 = "";
      if (cVar1 != '\0') {
        pcVar7 = "PROTOBUF_DEPRECATED_ENUM ";
      }
      pcVar4 = pcVar7 + 0x19;
      if (cVar1 == '\0') {
        pcVar4 = pcVar7;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar7,pcVar4);
      local_b0 = (cpp *)(*(long *)(this->descriptor_ + 0x28) + lVar6);
      EnumValueName_abi_cxx11_(&local_70,local_b0,enum_value);
      Formatter::operator()
                (&local_a8,"$1$static constexpr $resolved_name$ ${2$$3$$}$ =\n  $classname$_$3$;\n",
                 &local_50,(EnumValueDescriptor **)&local_b0,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      lVar5 = lVar5 + 1;
      pEVar3 = this->descriptor_;
      lVar6 = lVar6 + 0x20;
    } while (lVar5 < *(int *)(pEVar3 + 4));
  }
  Formatter::operator()
            (&local_a8,
             "static inline bool $nested_name$_IsValid(int value) {\n  return $classname$_IsValid(value);\n}\nstatic constexpr $resolved_name$ ${1$$nested_name$_MIN$}$ =\n  $classname$_$nested_name$_MIN;\nstatic constexpr $resolved_name$ ${1$$nested_name$_MAX$}$ =\n  $classname$_$nested_name$_MAX;\n"
             ,&this->descriptor_);
  if (this->generate_array_size_ == true) {
    Formatter::operator()
              (&local_a8,
               "static constexpr int ${1$$nested_name$_ARRAYSIZE$}$ =\n  $classname$_$nested_name$_ARRAYSIZE;\n"
               ,&this->descriptor_);
  }
  FVar2 = GetOptimizeFor(*(FileDescriptor **)(this->descriptor_ + 0x10),this->options_,(bool *)0x0);
  if (FVar2 != FileOptions_OptimizeMode_LITE_RUNTIME) {
    Formatter::operator()<>
              (&local_a8,
               "static inline const ::$proto_ns$::EnumDescriptor*\n$nested_name$_descriptor() {\n  return $classname$_descriptor();\n}\n"
              );
  }
  Formatter::operator()<>
            (&local_a8,
             "template<typename T>\nstatic inline const std::string& $nested_name$_Name(T enum_t_value) {\n  static_assert(::std::is_same<T, $resolved_name$>::value ||\n    ::std::is_integral<T>::value,\n    \"Incorrect type passed to function $nested_name$_Name.\");\n  return $classname$_Name(enum_t_value);\n}\n"
            );
  Formatter::operator()<>
            (&local_a8,
             "static inline bool $nested_name$_Parse(::PROTOBUF_NAMESPACE_ID::ConstStringParam name,\n    $resolved_name$* value) {\n  return $classname$_Parse(name, value);\n}\n"
            );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a8.vars_._M_t);
  return;
}

Assistant:

void EnumGenerator::GenerateSymbolImports(io::Printer* printer) const {
  Formatter format(printer, variables_);
  format("typedef $classname$ $resolved_name$;\n");

  for (int j = 0; j < descriptor_->value_count(); j++) {
    std::string deprecated_attr =
        DeprecatedAttribute(options_, descriptor_->value(j));
    format(
        "$1$static constexpr $resolved_name$ ${2$$3$$}$ =\n"
        "  $classname$_$3$;\n",
        deprecated_attr, descriptor_->value(j),
        EnumValueName(descriptor_->value(j)));
  }

  format(
      "static inline bool $nested_name$_IsValid(int value) {\n"
      "  return $classname$_IsValid(value);\n"
      "}\n"
      "static constexpr $resolved_name$ ${1$$nested_name$_MIN$}$ =\n"
      "  $classname$_$nested_name$_MIN;\n"
      "static constexpr $resolved_name$ ${1$$nested_name$_MAX$}$ =\n"
      "  $classname$_$nested_name$_MAX;\n",
      descriptor_);
  if (generate_array_size_) {
    format(
        "static constexpr int ${1$$nested_name$_ARRAYSIZE$}$ =\n"
        "  $classname$_$nested_name$_ARRAYSIZE;\n",
        descriptor_);
  }

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "static inline const ::$proto_ns$::EnumDescriptor*\n"
        "$nested_name$_descriptor() {\n"
        "  return $classname$_descriptor();\n"
        "}\n");
  }

  format(
      "template<typename T>\n"
      "static inline const std::string& $nested_name$_Name(T enum_t_value) {\n"
      "  static_assert(::std::is_same<T, $resolved_name$>::value ||\n"
      "    ::std::is_integral<T>::value,\n"
      "    \"Incorrect type passed to function $nested_name$_Name.\");\n"
      "  return $classname$_Name(enum_t_value);\n"
      "}\n");
  format(
      "static inline bool "
      "$nested_name$_Parse(::PROTOBUF_NAMESPACE_ID::ConstStringParam name,\n"
      "    $resolved_name$* value) {\n"
      "  return $classname$_Parse(name, value);\n"
      "}\n");
}